

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void deleted_doc_stat_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  fdb_config *__ptr;
  size_t metalen;
  size_t bodylen;
  fdb_config *pfVar4;
  uint uVar5;
  ulong unaff_RBP;
  char *pcVar6;
  fdb_file_handle **ptr_fhandle;
  ulong uVar7;
  char *kvs_config;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  fdb_doc _doc;
  timeval __test_begin;
  fdb_file_info info;
  char bodybuf [256];
  char keybuf [256];
  fdb_doc *pfStack_f38;
  fdb_kvs_handle *pfStack_f30;
  fdb_file_handle *pfStack_f28;
  timeval tStack_f20;
  fdb_kvs_config fStack_f10;
  fdb_config fStack_ef8;
  char acStack_e00 [256];
  char *pcStack_d00;
  fdb_config *pfStack_cf8;
  fdb_config *pfStack_cf0;
  fdb_file_handle *pfStack_ce0;
  fdb_kvs_handle *pfStack_cd8;
  fdb_kvs_config fStack_cd0;
  timeval tStack_cb8;
  char acStack_ca8 [264];
  fdb_config fStack_ba0;
  char acStack_aa8 [256];
  char acStack_9a8 [264];
  char *pcStack_8a0;
  fdb_file_handle **ppfStack_898;
  fdb_config *pfStack_888;
  fdb_kvs_config *pfStack_880;
  code *pcStack_878;
  fdb_kvs_handle *pfStack_860;
  fdb_file_handle *pfStack_858;
  fdb_iterator *pfStack_850;
  timeval tStack_848;
  fdb_kvs_config fStack_838;
  fdb_file_handle *apfStack_820 [32];
  fdb_config fStack_720;
  fdb_config fStack_618;
  char acStack_520 [264];
  fdb_config *pfStack_418;
  fdb_file_handle *local_3e0;
  fdb_kvs_handle *local_3d8;
  fdb_doc *local_3d0;
  fdb_doc local_3c8;
  fdb_kvs_config local_378;
  timeval local_360;
  undefined1 local_350 [72];
  fdb_config local_308;
  char local_208 [256];
  fdb_config local_108;
  
  gettimeofday(&local_360,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  local_3c8.size_ondisk = 0;
  local_3c8.meta = (void *)0x0;
  local_3c8.offset = 0;
  local_3c8.metalen = 0;
  local_3c8.bodylen = 0;
  local_3c8.deleted = false;
  local_3c8._73_3_ = 0;
  local_3c8.flags = 0;
  local_3c8.key = local_208;
  local_3c8.body = &local_308;
  local_3c8.seqnum = 0xffffffffffffffff;
  pfVar4 = &local_108;
  fdb_get_default_config();
  local_108.purging_interval = 0;
  fdb_get_default_kvs_config();
  fVar2 = fdb_open(&local_3e0,"./dummy1",pfVar4);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open(local_3e0,&local_3d8,"main",&local_378);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b48;
    local_208[0] = 'K';
    local_208[1] = '\0';
    pfVar4 = &local_308;
    local_308.chunksize = 0x6f62;
    local_308._2_2_ = 0x7964;
    local_308.blocksize._0_1_ = 0;
    sVar3 = strlen(local_208);
    local_3c8.keylen = sVar3 + 1;
    sVar3 = strlen((char *)pfVar4);
    local_3c8.bodylen = sVar3 + 1;
    fVar2 = fdb_set(local_3d8,&local_3c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4d;
    fVar2 = fdb_del(local_3d8,&local_3c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b52;
    pfVar4 = (fdb_config *)&local_3d0;
    fdb_doc_create((fdb_doc **)pfVar4,local_3c8.key,local_3c8.keylen,(void *)0x0,0,(void *)0x0,0);
    fVar2 = fdb_get(local_3d8,local_3d0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b57;
    fdb_doc_free(local_3d0);
    fdb_get_file_info(local_3e0,(fdb_file_info *)local_350);
    pfVar4 = (fdb_config *)(local_350 + 0x10);
    if (local_350._16_8_ != 0) {
      deleted_doc_stat_test();
    }
    fVar2 = fdb_commit(local_3e0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5c;
    fdb_get_file_info(local_3e0,(fdb_file_info *)local_350);
    if (local_350._16_8_ != 0) {
      deleted_doc_stat_test();
    }
    fVar2 = fdb_kvs_close(local_3d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b61;
    fVar2 = fdb_close(local_3e0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar6,"deleted doc stat test");
      return;
    }
  }
  else {
    deleted_doc_stat_test();
LAB_00110b48:
    deleted_doc_stat_test();
LAB_00110b4d:
    deleted_doc_stat_test();
LAB_00110b52:
    deleted_doc_stat_test();
LAB_00110b57:
    deleted_doc_stat_test();
LAB_00110b5c:
    deleted_doc_stat_test();
LAB_00110b61:
    deleted_doc_stat_test();
  }
  deleted_doc_stat_test();
  pcStack_878 = (code *)0x110b88;
  pfStack_418 = pfVar4;
  gettimeofday(&tStack_848,(__timezone_ptr_t)0x0);
  pcStack_878 = (code *)0x110b8d;
  memleak_start();
  pcVar6 = acStack_520;
  builtin_strncpy(acStack_520,"./dummy1",9);
  pcStack_878 = (code *)0x110bb2;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar4 = &fStack_618;
  pcStack_878 = (code *)0x110bc2;
  fdb_get_default_config();
  fStack_618.buffercache_size = 0;
  kvs_config = &fStack_838.create_if_missing;
  pcStack_878 = (code *)0x110bd7;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_858;
  pcStack_878 = (code *)0x110bea;
  fdb_open(ptr_fhandle,pcVar6,pfVar4);
  pcStack_878 = (code *)0x110c02;
  fVar2 = fdb_kvs_open(pfStack_858,&pfStack_860,"db1",(fdb_kvs_config *)kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9c;
  unaff_RBP = 0;
  do {
    pcStack_878 = (code *)0x110c33;
    sprintf((char *)&fStack_720,"key%05d",unaff_RBP);
    pcStack_878 = (code *)0x110c42;
    sprintf((char *)apfStack_820,"value%05d",unaff_RBP);
    pfVar1 = pfStack_860;
    pcStack_878 = (code *)0x110c4f;
    sVar3 = strlen((char *)&fStack_720);
    pcVar6 = (char *)(sVar3 + 1);
    pcStack_878 = (code *)0x110c5b;
    sVar3 = strlen((char *)apfStack_820);
    pcStack_878 = (code *)0x110c70;
    fVar2 = fdb_set_kv(pfVar1,&fStack_720,(size_t)pcVar6,apfStack_820,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_878 = (code *)0x110d97;
      complete_delete_test();
      goto LAB_00110d97;
    }
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_878 = (code *)0x110c91;
  fdb_commit(pfStack_858,'\x01');
  pcVar6 = "key%05d";
  pfVar4 = &fStack_720;
  kvs_config = "value%05d";
  ptr_fhandle = apfStack_820;
  unaff_RBP = 0;
  do {
    pcStack_878 = (code *)0x110cbd;
    sprintf((char *)pfVar4,"key%05d",unaff_RBP);
    pcStack_878 = (code *)0x110ccc;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    pfVar1 = pfStack_860;
    pcStack_878 = (code *)0x110cd9;
    sVar3 = strlen((char *)pfVar4);
    pcStack_878 = (code *)0x110ce8;
    fVar2 = fdb_del_kv(pfVar1,pfVar4,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d97;
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_878 = (code *)0x110d09;
  fdb_commit(pfStack_858,'\x01');
  pcStack_878 = (code *)0x110d29;
  fVar2 = fdb_iterator_init(pfStack_860,&pfStack_850,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110da1;
  pcStack_878 = (code *)0x110d37;
  fVar2 = fdb_iterator_close(pfStack_850);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_878 = (code *)0x110d45;
    fdb_close(pfStack_858);
    pcStack_878 = (code *)0x110d4a;
    fdb_shutdown();
    pcStack_878 = (code *)0x110d4f;
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    pcStack_878 = (code *)0x110d80;
    fprintf(_stderr,pcVar6,"complete delete");
    return;
  }
  goto LAB_00110da6;
LAB_00110d97:
  pfVar4 = &fStack_720;
  ptr_fhandle = apfStack_820;
  kvs_config = "value%05d";
  pcStack_878 = (code *)0x110d9c;
  complete_delete_test();
LAB_00110d9c:
  pcStack_878 = (code *)0x110da1;
  complete_delete_test();
LAB_00110da1:
  pcStack_878 = (code *)0x110da6;
  complete_delete_test();
LAB_00110da6:
  pcStack_878 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_cf0 = (fdb_config *)0x110dc8;
  pcStack_8a0 = pcVar6;
  ppfStack_898 = ptr_fhandle;
  pfStack_888 = pfVar4;
  pfStack_880 = (fdb_kvs_config *)kvs_config;
  pcStack_878 = (code *)unaff_RBP;
  gettimeofday(&tStack_cb8,(__timezone_ptr_t)0x0);
  pfStack_cf0 = (fdb_config *)0x110dcd;
  memleak_start();
  pfStack_cf0 = (fdb_config *)0x110dd7;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_cf0 = (fdb_config *)0x110de6;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar4 = &fStack_ba0;
  pfStack_cf0 = (fdb_config *)0x110df6;
  fdb_get_default_config();
  pfStack_cf0 = (fdb_config *)0x110e00;
  fdb_get_default_kvs_config();
  pfStack_cf0 = (fdb_config *)0x110e14;
  fVar2 = fdb_open(&pfStack_ce0,"./dummy1",pfVar4);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_cf0 = (fdb_config *)0x110e32;
    fVar2 = fdb_kvs_open(pfStack_ce0,&pfStack_cd8,(char *)0x0,&fStack_cd0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb7;
    pcVar6 = (char *)0x0;
    uVar7 = 0;
    do {
      pfStack_cf0 = (fdb_config *)0x110e5b;
      sprintf(acStack_9a8,"key%128d",uVar7 & 0xffffffff);
      pfStack_cf0 = (fdb_config *)0x110e77;
      sprintf(acStack_aa8,"meta%128d",uVar7 & 0xffffffff);
      pfStack_cf0 = (fdb_config *)0x110e8d;
      sprintf(acStack_ca8,"body%128d",uVar7 & 0xffffffff);
      pfStack_cf0 = (fdb_config *)0x110e99;
      sVar3 = strlen(acStack_9a8);
      pfStack_cf0 = (fdb_config *)0x110ea7;
      metalen = strlen(acStack_aa8);
      pfStack_cf0 = (fdb_config *)0x110eb4;
      bodylen = strlen(acStack_ca8);
      pfStack_cf0 = (fdb_config *)0x110ede;
      fdb_doc_create((fdb_doc **)(pcVar6 + (long)&__ptr->chunksize),acStack_9a8,sVar3,acStack_aa8,
                     metalen,acStack_ca8,bodylen);
      pfStack_cf0 = (fdb_config *)0x110eec;
      fdb_set(pfStack_cd8,*(fdb_doc **)(&__ptr->chunksize + uVar7 * 4));
      pfStack_cf0 = (fdb_config *)0x110ef5;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar7 * 4));
      uVar7 = uVar7 + 1;
      pcVar6 = pcVar6 + 8;
    } while (uVar7 != 500000);
    pfStack_cf0 = (fdb_config *)0x110f13;
    fVar2 = fdb_kvs_close(pfStack_cd8);
    pfVar4 = __ptr;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fbc;
    pfStack_cf0 = (fdb_config *)0x110f25;
    fVar2 = fdb_close(pfStack_ce0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fc1;
    pfStack_cf0 = (fdb_config *)0x110f46;
    fVar2 = fdb_open(&pfStack_ce0,"./dummy1",&fStack_ba0);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f5d:
      pfStack_cf0 = (fdb_config *)0x110f65;
      free(__ptr);
      pfStack_cf0 = (fdb_config *)0x110f6a;
      fdb_shutdown();
      pfStack_cf0 = (fdb_config *)0x110f6f;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_cf0 = (fdb_config *)0x110fa0;
      fprintf(_stderr,pcVar6,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_cf0 = (fdb_config *)0x110f59;
      fVar2 = fdb_close(pfStack_ce0);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      goto LAB_00110fcb;
    }
  }
  else {
    pfStack_cf0 = (fdb_config *)0x110fb7;
    large_batch_write_no_commit_test();
LAB_00110fb7:
    pfStack_cf0 = (fdb_config *)0x110fbc;
    large_batch_write_no_commit_test();
LAB_00110fbc:
    pfStack_cf0 = (fdb_config *)0x110fc1;
    large_batch_write_no_commit_test();
LAB_00110fc1:
    pfStack_cf0 = (fdb_config *)0x110fc6;
    large_batch_write_no_commit_test();
  }
  pfStack_cf0 = (fdb_config *)0x110fcb;
  large_batch_write_no_commit_test();
LAB_00110fcb:
  pfStack_cf0 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_d00 = pcVar6;
  pfStack_cf8 = pfVar4;
  pfStack_cf0 = __ptr;
  gettimeofday(&tStack_f20,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_ef8.wal_threshold = 0x400;
  fStack_ef8.seqtree_opt = '\x01';
  fStack_ef8.purging_interval = 1;
  fStack_ef8.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_f28,"./dummy1",&fStack_ef8);
  fdb_kvs_open(pfStack_f28,&pfStack_f30,"db1",&fStack_f10);
  sprintf(acStack_e00,"key%d",0);
  sVar3 = strlen(acStack_e00);
  fdb_doc_create(&pfStack_f38,acStack_e00,sVar3,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_f30,pfStack_f38);
  fVar2 = fdb_get(pfStack_f30,pfStack_f38);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_f30,pfStack_f38);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_f30,pfStack_f38);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_f30,pfStack_f38);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_f30,pfStack_f38);
        fVar2 = fdb_get(pfStack_f30,pfStack_f38);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_f38->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_f30,pfStack_f38);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_f38->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar2 = fdb_get_metaonly_byseq(pfStack_f30,pfStack_f38);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (pfStack_f38->deleted != false) {
                fVar2 = fdb_get_byoffset(pfStack_f30,pfStack_f38);
                if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_f38->deleted != false) {
                    fdb_doc_free(pfStack_f38);
                    fdb_kvs_close(pfStack_f30);
                    fdb_close(pfStack_f28);
                    fdb_shutdown();
                    memleak_end();
                    pcVar6 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar6 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar6,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void deleted_doc_stat_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc _doc;
    fdb_doc *doc = &_doc;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_file_info info;
    fdb_kvs_config kvs_config;
    char keybuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    memset(doc, 0, sizeof(fdb_doc));
    doc->key = &keybuf[0];
    doc->body = &bodybuf[0];
    doc->seqnum = SEQNUM_NOT_USED;

    // open dbfile
    fconfig = fdb_get_default_config();
    fconfig.purging_interval = 0;
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, "main", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    sprintf(keybuf, "K"); // This is necessary to set keysize to 2 bytes so
    sprintf(bodybuf, "body"); // it matches KV_header doc's keysize of 10
    doc->keylen = strlen(keybuf) + 1; // in multi-kv mode and hits MB-16491
    doc->bodylen = strlen(bodybuf) + 1;
    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Delete the doc
    status = fdb_del(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Fetch the doc back
    fdb_doc_create(&rdoc, doc->key, doc->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    fdb_doc_free(rdoc);

    // check the file info
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 0);

    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check the file info again after commit..
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 0);

    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("deleted doc stat test");
}